

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspa.c
# Opt level: O0

aspa_status aspa_table_src_remove(aspa_table *aspa_table,rtr_socket *rtr_socket,_Bool notify)

{
  long lVar1;
  aspa_store_node **node_00;
  long in_FS_OFFSET;
  aspa_status res;
  aspa_store_node **node;
  _Bool notify_local;
  rtr_socket *rtr_socket_local;
  aspa_table *aspa_table_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pthread_rwlock_wrlock((pthread_rwlock_t *)&aspa_table->update_lock);
  pthread_rwlock_wrlock((pthread_rwlock_t *)aspa_table);
  node_00 = aspa_store_get_node(&aspa_table->store,rtr_socket);
  if ((node_00 == (aspa_store_node **)0x0) || (*node_00 == (aspa_store_node *)0x0)) {
    pthread_rwlock_unlock((pthread_rwlock_t *)aspa_table);
    aspa_table_local._4_4_ = ASPA_SUCCESS;
  }
  else {
    aspa_table_local._4_4_ = aspa_table_remove_node(aspa_table,node_00,notify);
    pthread_rwlock_unlock((pthread_rwlock_t *)aspa_table);
    pthread_rwlock_unlock((pthread_rwlock_t *)&aspa_table->update_lock);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return aspa_table_local._4_4_;
  }
  __stack_chk_fail();
}

Assistant:

aspa_status aspa_table_src_remove(struct aspa_table *aspa_table, struct rtr_socket *rtr_socket,
						     bool notify)
{
	pthread_rwlock_wrlock(&aspa_table->update_lock);
	pthread_rwlock_wrlock(&aspa_table->lock);

	struct aspa_store_node **node = aspa_store_get_node(&aspa_table->store, rtr_socket);

	if (!node || !*node) {
		// Already gone
		pthread_rwlock_unlock(&(aspa_table->lock));
		return ASPA_SUCCESS;
	}

	enum aspa_status res = aspa_table_remove_node(aspa_table, node, notify);

	pthread_rwlock_unlock(&(aspa_table->lock));
	pthread_rwlock_unlock(&aspa_table->update_lock);
	return res;
}